

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O0

bool __thiscall Refal2::CUnit::IsEqualWith(CUnit *this,CUnit *unit)

{
  TUnitType TVar1;
  CUnit *unit_local;
  CUnit *this_local;
  
  if (this->type == unit->type) {
    TVar1 = this->type;
    if (TVar1 == UT_Char) {
      this_local._7_1_ = (this->field_1).c == (unit->field_1).c;
    }
    else if (TVar1 == UT_Label) {
      this_local._7_1_ = (this->field_1).label == (unit->field_1).label;
    }
    else if (TVar1 == UT_Number) {
      this_local._7_1_ = (this->field_1).label == (unit->field_1).label;
    }
    else if (TVar1 == UT_Variable) {
      this_local._7_1_ = (this->field_1).label == (unit->field_1).label;
    }
    else {
      if ((((TVar1 != UT_LeftParen) && (TVar1 != UT_RightParen)) && (TVar1 != UT_LeftBracket)) &&
         (TVar1 != UT_RightBracket)) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                      ,0x35,"bool Refal2::CUnit::IsEqualWith(const CUnit &) const");
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CUnit::IsEqualWith( const CUnit& unit ) const
{
	if( type != unit.type ) {
		return false;
	}
	switch( type ) {
		case UT_Char:
			return ( c == unit.c );
			break;
		case UT_Label:
			return ( label == unit.label );
			break;
		case UT_Number:
			return ( number == unit.number );
			break;
		case UT_Variable:
			return ( variable == unit.variable );
			break;
		case UT_LeftParen:
		case UT_RightParen:
		case UT_LeftBracket:
		case UT_RightBracket:
			return true;
		default:
			break;
	}
	assert( false );
	return false;
}